

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::DecimalFormat::format
          (DecimalFormat *this,int64_t number,UnicodeString *appendTo,FieldPosition *pos)

{
  short sVar1;
  int32_t offset;
  FormattedNumber output;
  UErrorCode localStatus;
  UnicodeStringAppendable appendable;
  undefined1 auStack_48 [24];
  UnicodeStringAppendable local_30;
  
  if (((pos->fField == -1) && (number + 0x7fffffffU < 0xffffffff)) &&
     (this->fields->canUseFastFormat != false)) {
    doFastFormatInt32(this,(int32_t)number,SUB81((ulong)number >> 0x3f,0),appendTo);
  }
  else {
    auStack_48._20_4_ = 0;
    icu_63::number::LocalizedNumberFormatter::formatInt
              ((LocalizedNumberFormatter *)auStack_48,
               (int64_t)(this->fields->formatter).
                        super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>.ptr,
               (UErrorCode *)number);
    sVar1 = (appendTo->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      offset = (appendTo->fUnion).fFields.fLength;
    }
    else {
      offset = (int)sVar1 >> 5;
    }
    fieldPositionHelper((FormattedNumber *)auStack_48,pos,offset,(UErrorCode *)(auStack_48 + 0x14));
    local_30.super_Appendable.super_UObject._vptr_UObject =
         (UObject)&PTR__UnicodeStringAppendable_003be2c0;
    local_30.str = appendTo;
    icu_63::number::FormattedNumber::appendTo
              ((FormattedNumber *)auStack_48,&local_30.super_Appendable);
    UnicodeStringAppendable::~UnicodeStringAppendable(&local_30);
    icu_63::number::FormattedNumber::~FormattedNumber((FormattedNumber *)auStack_48);
  }
  return appendTo;
}

Assistant:

UnicodeString& DecimalFormat::format(int64_t number, UnicodeString& appendTo, FieldPosition& pos) const {
    if (pos.getField() == FieldPosition::DONT_CARE && fastFormatInt64(number, appendTo)) {
        return appendTo;
    }
    UErrorCode localStatus = U_ZERO_ERROR;
    FormattedNumber output = fields->formatter->formatInt(number, localStatus);
    fieldPositionHelper(output, pos, appendTo.length(), localStatus);
    auto appendable = UnicodeStringAppendable(appendTo);
    output.appendTo(appendable);
    return appendTo;
}